

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

bool anon_unknown.dwarf_5fce8::isNullableAndMutable(Expression *ref,Index fieldIndex)

{
  undefined1 local_28 [8];
  optional<wasm::Field> field;
  
  wasm::GCTypeUtils::getField((optional<wasm::Field> *)local_28,(Type)(ref->type).id,fieldIndex);
  if (field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Field>._M_payload.field2[8] != '\0') {
    return ((local_28._0_4_ & 3) == 2 && 6 < (ulong)local_28) &&
           field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Field>._M_payload._4_4_ == 1;
  }
  __assert_fail("field",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                ,0x3e,"bool (anonymous namespace)::isNullableAndMutable(Expression *, Index)");
}

Assistant:

bool isNullableAndMutable(Expression* ref, Index fieldIndex) {
  // Find the field for the given reference, and check its properties.
  auto field = GCTypeUtils::getField(ref->type, fieldIndex);
  assert(field);
  return field->type.isNullable() && field->mutable_ == Mutable;
}